

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O0

void __thiscall wasm::FeatureSet::setAll(FeatureSet *this)

{
  bool v;
  bool oldGCNNLocals;
  FeatureSet *this_local;
  
  v = hasGCNNLocals(this);
  this->features = 0x1ffff;
  setGCNNLocals(this,v);
  return;
}

Assistant:

void setAll() {
    // Do not set GCNNLocals, which forces the user to opt in to that feature
    // explicitly. That is, wasm-opt -all will enable GC but *not* enable
    // non-nullable locals. To get them, do wasm-opt -all --enable-gc-nn-locals
    // FIXME: When the wasm spec stabilizes, this feature will go away, as the
    //        non-nullable locals experiment will either become the standard,
    //        or it will go away.
    // Leave the old GCNNLocals value unmodified. This makes things like
    // --enable-gc-nn-locals -all work (that is, if we enable the feature,
    // then -all does not disable it; it simply does not enable it by itself).
    auto oldGCNNLocals = hasGCNNLocals();
    features = AllPossible;
    setGCNNLocals(oldGCNNLocals);
  }